

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.cpp
# Opt level: O0

bool ast::case_insensitive_compare(Symbol *a,Symbol *b)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  int char_b;
  int char_a;
  uint i;
  size_type size;
  Symbol *b_local;
  Symbol *a_local;
  
  uVar3 = std::__cxx11::string::size();
  char_b = 0;
  while( true ) {
    if (uVar3 <= (uint)char_b) {
      uVar3 = std::__cxx11::string::size();
      uVar5 = std::__cxx11::string::size();
      return uVar3 < uVar5;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&a->name);
    iVar1 = tolower((int)*pcVar4);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&b->name);
    iVar2 = tolower((int)*pcVar4);
    if (iVar1 != iVar2) break;
    char_b = char_b + 1;
  }
  return iVar1 < iVar2;
}

Assistant:

static bool case_insensitive_compare(Symbol *a, Symbol *b)
{
	auto size = a->name.size();
	for (auto i = 0U; i < size; ++i) {
		auto char_a = tolower(a->name[i]);
		auto char_b = tolower(b->name[i]);
		if (char_a != char_b)
			return char_a < char_b;
	}
	return a->name.size() < b->name.size();
}